

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float x2;
  char cVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  byte bVar5;
  uint uVar6;
  int i;
  ImGuiID id;
  byte *pbVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiTableColumn *pIVar9;
  char *pcVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float y2;
  byte local_142;
  bool local_141;
  float local_138;
  float local_118;
  ImGuiWindow *inner_window;
  ImGuiID context_menu_id;
  float unused_x1;
  bool is_visible;
  float max_width;
  ImGuiTableColumn *column_4;
  int column_n_3;
  int order_n_2;
  ImRect host_clip_rect;
  float offset_x;
  bool offset_x_frozen;
  int visible_n;
  bool is_hovering_table;
  ImRect mouse_hit_rect;
  ImGuiTableColumn *column_3;
  int order_n_1;
  float weight_ratio;
  ImGuiTableColumn *column_2;
  float local_88;
  int column_n_2;
  float width_remaining_for_stretched_columns;
  float width_avail_for_stretched_columns;
  float width_avail;
  float width_spacings;
  ImRect work_rect;
  float width_auto;
  bool column_is_resizable_1;
  ImGuiTableColumn *column_1;
  int column_n_1;
  float stretch_sum_weights;
  float sum_width_requests;
  bool column_is_resizable;
  bool start_auto_fit;
  ImGuiTableColumn *column;
  float local_38;
  int column_n;
  int order_n;
  float fixed_max_width_auto;
  float stretch_sum_width_auto;
  bool has_resizable;
  int iStack_24;
  bool has_auto_fit_request;
  int last_visible_column_idx;
  int count_stretch;
  int count_fixed;
  ImGuiTableFlags table_sizing_policy;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  pIVar4 = GImGui;
  if ((table->IsLayoutLocked & 1U) != 0) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x2a2,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar6 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByIndex = 0;
  table->EnabledMaskByDisplayOrder = 0;
  fVar14 = ImMax<float>(1.0,(pIVar4->Style).FramePadding.x * 1.0);
  table->MinColumnWidth = fVar14;
  last_visible_column_idx = 0;
  iStack_24 = 0;
  stretch_sum_width_auto = -NAN;
  bVar13 = false;
  bVar3 = false;
  order_n = 0;
  column_n = 0;
  for (local_38 = 0.0; (int)local_38 < table->ColumnsCount; local_38 = (float)((int)local_38 + 1)) {
    pbVar7 = (byte *)ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,(int)local_38);
    bVar11 = *pbVar7;
    fVar14 = (float)(int)(char)bVar11;
    if (fVar14 != local_38) {
      table->IsDefaultDisplayOrder = false;
    }
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)fVar14);
    if ((int)table->DeclColumnsCount <= (int)fVar14) {
      TableSetupColumnFlags(table,pIVar8,0);
      pIVar8->NameOffset = -1;
      pIVar8->UserID = 0;
      pIVar8->InitStretchWeightOrWidth = -1.0;
    }
    if (((table->Flags & 4U) == 0) || ((pIVar8->Flags & 0x80U) != 0)) {
      pIVar8->IsEnabledNextFrame = true;
    }
    if ((pIVar8->IsEnabled & 1U) != (pIVar8->IsEnabledNextFrame & 1U)) {
      pIVar8->IsEnabled = (bool)(pIVar8->IsEnabledNextFrame & 1);
      table->IsSettingsDirty = true;
      if (((pIVar8->IsEnabled & 1U) == 0) && (pIVar8->SortOrder != -1)) {
        table->IsSortSpecsDirty = true;
      }
    }
    if (('\0' < pIVar8->SortOrder) && ((table->Flags & 0x2000000U) == 0)) {
      table->IsSortSpecsDirty = true;
    }
    if ((pIVar8->Flags & 8U) == 0) {
      bVar12 = pIVar8->StretchWeight <= 0.0 && pIVar8->StretchWeight != 0.0;
    }
    else {
      bVar12 = pIVar8->WidthRequest <= 0.0 && pIVar8->WidthRequest != 0.0;
    }
    if (bVar12) {
      pIVar8->CannotSkipItemsQueue = '\a';
      pIVar8->AutoFitQueue = '\a';
    }
    if ((pIVar8->IsEnabled & 1U) == 0) {
      pIVar8->IndexWithinEnabledSet = -1;
    }
    else {
      pIVar8->PrevEnabledColumn = SUB41(stretch_sum_width_auto,0);
      pIVar8->NextEnabledColumn = -1;
      if (stretch_sum_width_auto != -NAN) {
        pIVar9 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)stretch_sum_width_auto);
        pIVar9->NextEnabledColumn = bVar11;
      }
      cVar1 = table->ColumnsEnabledCount;
      table->ColumnsEnabledCount = cVar1 + '\x01';
      pIVar8->IndexWithinEnabledSet = cVar1;
      table->EnabledMaskByIndex = 1L << (bVar11 & 0x3f) | table->EnabledMaskByIndex;
      table->EnabledMaskByDisplayOrder =
           1L << (pIVar8->DisplayOrder & 0x3fU) | table->EnabledMaskByDisplayOrder;
      if (pIVar8->DisplayOrder < pIVar8->IndexWithinEnabledSet) {
        __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0x2e7,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      if ((pIVar8->IsPreserveWidthAuto & 1U) == 0) {
        fVar15 = TableGetColumnWidthAuto(table,pIVar8);
        pIVar8->WidthAuto = fVar15;
      }
      bVar12 = (pIVar8->Flags & 0x20U) == 0;
      if (bVar12) {
        bVar3 = true;
      }
      if ((((pIVar8->Flags & 8U) != 0) && (0.0 < pIVar8->InitStretchWeightOrWidth)) && (!bVar12)) {
        pIVar8->WidthAuto = pIVar8->InitStretchWeightOrWidth;
      }
      if (pIVar8->AutoFitQueue != '\0') {
        bVar13 = true;
      }
      stretch_sum_width_auto = fVar14;
      if ((pIVar8->Flags & 4U) == 0) {
        column_n = (int)ImMax<float>((float)column_n,pIVar8->WidthAuto);
        last_visible_column_idx = last_visible_column_idx + 1;
      }
      else {
        order_n = (int)(pIVar8->WidthAuto + (float)order_n);
        iStack_24 = iStack_24 + 1;
      }
    }
  }
  if ((((table->Flags & 8U) != 0) && (table->SortSpecsCount == '\0')) &&
     ((table->Flags & 0x4000000U) == 0)) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = SUB41(stretch_sum_width_auto,0);
  if (table->RightMostEnabledColumn < '\0') {
    __assert_fail("table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x305,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if ((bVar13) && (table->OuterWindow != table->InnerWindow)) {
    table->InnerWindow->SkipItems = false;
  }
  if (bVar13) {
    table->IsSettingsDirty = true;
  }
  column_n_1 = 0;
  column_1._4_4_ = 0.0;
  table->RightMostStretchedColumn = -1;
  table->LeftMostStretchedColumn = -1;
  for (column_1._0_4_ = 0; (int)column_1 < table->ColumnsCount; column_1._0_4_ = (int)column_1 + 1)
  {
    bVar11 = (byte)(int)column_1;
    if ((table->EnabledMaskByIndex & 1L << (bVar11 & 0x3f)) != 0) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)column_1);
      work_rect.Max.y._3_1_ = (pIVar8->Flags & 0x20U) == 0;
      if ((pIVar8->Flags & 8U) == 0) {
        if (((pIVar8->AutoFitQueue != '\0') ||
            (pIVar8->StretchWeight <= 0.0 && pIVar8->StretchWeight != 0.0)) ||
           (!(bool)work_rect.Max.y._3_1_)) {
          if (pIVar8->InitStretchWeightOrWidth <= 0.0) {
            if (uVar6 == 0x6000) {
              pIVar8->StretchWeight = (pIVar8->WidthAuto / (float)order_n) * (float)iStack_24;
            }
            else {
              pIVar8->StretchWeight = 1.0;
            }
          }
          else {
            pIVar8->StretchWeight = pIVar8->InitStretchWeightOrWidth;
          }
        }
        column_1._4_4_ = pIVar8->StretchWeight + column_1._4_4_;
        if ((table->LeftMostStretchedColumn == -1) ||
           (pIVar9 = ImSpan<ImGuiTableColumn>::operator[]
                               (&table->Columns,(int)table->LeftMostStretchedColumn),
           pIVar8->DisplayOrder < pIVar9->DisplayOrder)) {
          table->LeftMostStretchedColumn = bVar11;
        }
        if ((table->RightMostStretchedColumn == -1) ||
           (pIVar9 = ImSpan<ImGuiTableColumn>::operator[]
                               (&table->Columns,(int)table->RightMostStretchedColumn),
           pIVar9->DisplayOrder < pIVar8->DisplayOrder)) {
          table->RightMostStretchedColumn = bVar11;
        }
      }
      else {
        work_rect.Max.x = pIVar8->WidthAuto;
        if ((uVar6 == 0x4000) && ((pIVar8->AutoFitQueue != '\0' || (!(bool)work_rect.Max.y._3_1_))))
        {
          work_rect.Max.x = (float)column_n;
        }
        if (pIVar8->AutoFitQueue == '\0') {
          if ((((pIVar8->Flags & 8U) != 0) && (!(bool)work_rect.Max.y._3_1_)) &&
             ((table->RequestOutputMaskByIndex & 1L << (bVar11 & 0x3f)) != 0)) {
            pIVar8->WidthRequest = work_rect.Max.x;
          }
        }
        else {
          pIVar8->WidthRequest = work_rect.Max.x;
        }
        if (((1 < pIVar8->AutoFitQueue) && ((table->IsInitializing & 1U) != 0)) &&
           ((pIVar8->IsPreserveWidthAuto & 1U) == 0)) {
          fVar14 = ImMax<float>(pIVar8->WidthRequest,table->MinColumnWidth * 4.0);
          pIVar8->WidthRequest = fVar14;
        }
        column_n_1 = (int)(pIVar8->WidthRequest + (float)column_n_1);
      }
      pIVar8->IsPreserveWidthAuto = false;
      column_n_1 = (int)(table->CellPaddingX + table->CellPaddingX + (float)column_n_1);
    }
  }
  table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)last_visible_column_idx;
  _width_avail = (table->WorkRect).Min;
  work_rect.Min = (table->WorkRect).Max;
  fVar14 = table->OuterPaddingX + table->OuterPaddingX +
           (table->CellSpacingX1 + table->CellSpacingX2) * (float)(table->ColumnsEnabledCount + -1);
  if ((((table->Flags & 0x800000U) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    local_118 = ImRect::GetWidth((ImRect *)&width_avail);
  }
  else {
    local_118 = ImRect::GetWidth(&table->InnerClipRect);
  }
  fVar15 = (local_118 - fVar14) - (float)column_n_1;
  table->ColumnsGivenWidth =
       table->CellPaddingX * 2.0 * (float)(int)table->ColumnsEnabledCount + fVar14;
  local_88 = fVar15;
  for (column_2._4_4_ = 0; column_2._4_4_ < table->ColumnsCount; column_2._4_4_ = column_2._4_4_ + 1
      ) {
    if ((table->EnabledMaskByIndex & 1L << ((byte)column_2._4_4_ & 0x3f)) != 0) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_2._4_4_);
      if ((pIVar8->Flags & 4U) != 0) {
        fVar14 = ImMax<float>(fVar15 * (pIVar8->StretchWeight / column_1._4_4_),
                              table->MinColumnWidth);
        pIVar8->WidthRequest = (float)(int)(fVar14 + 0.01);
        local_88 = local_88 - pIVar8->WidthRequest;
      }
      if ((pIVar8->NextEnabledColumn == -1) && (table->LeftMostStretchedColumn != -1)) {
        pIVar8->Flags = pIVar8->Flags | 0x40000000;
      }
      fVar14 = ImMax<float>(pIVar8->WidthRequest,table->MinColumnWidth);
      fVar14 = ImFloor(fVar14);
      pIVar8->WidthGiven = fVar14;
      table->ColumnsGivenWidth = pIVar8->WidthGiven + table->ColumnsGivenWidth;
    }
  }
  if ((1.0 <= local_88) && ((table->Flags & 0x40000U) == 0)) {
    column_3._0_4_ = table->ColumnsCount;
    while( true ) {
      column_3._0_4_ = (int)column_3 + -1;
      bVar13 = false;
      if ((0.0 < column_1._4_4_) && (bVar13 = false, 1.0 <= local_88)) {
        bVar13 = -1 < (int)column_3;
      }
      if (!bVar13) break;
      if ((table->EnabledMaskByDisplayOrder & 1L << ((byte)(int)column_3 & 0x3f)) != 0) {
        pcVar10 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,(int)column_3);
        mouse_hit_rect.Max =
             (ImVec2)ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)*pcVar10);
        if ((*(uint *)mouse_hit_rect.Max & 4) != 0) {
          *(float *)((long)mouse_hit_rect.Max + 0x10) =
               *(float *)((long)mouse_hit_rect.Max + 0x10) + 1.0;
          *(float *)((long)mouse_hit_rect.Max + 4) = *(float *)((long)mouse_hit_rect.Max + 4) + 1.0;
          local_88 = local_88 - 1.0;
        }
      }
    }
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar14 = (table->OuterRect).Min.x;
  fVar15 = (table->OuterRect).Min.y;
  x2 = (table->OuterRect).Max.x;
  y2 = ImMax<float>((table->OuterRect).Max.y,(table->OuterRect).Min.y + table->LastOuterHeight);
  ImRect::ImRect((ImRect *)&visible_n,fVar14,fVar15,x2,y2);
  bVar13 = ItemHoverable((ImRect *)&visible_n,0);
  offset_x = 0.0;
  host_clip_rect.Max.y._3_1_ = '\0' < table->FreezeColumnsCount;
  if (table->FreezeColumnsCount < '\x01') {
    local_138 = width_avail;
  }
  else {
    local_138 = (table->OuterRect).Min.x;
  }
  host_clip_rect.Max.x = (local_138 + table->OuterPaddingX) - table->CellSpacingX1;
  _column_n_3 = (table->InnerClipRect).Min;
  host_clip_rect.Min = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  column_4._4_4_ = 0;
  do {
    if (table->ColumnsCount <= column_4._4_4_) {
      fVar14 = (table->WorkRect).Min.x;
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         (&table->Columns,(int)table->RightMostEnabledColumn);
      fVar14 = ImMax<float>(fVar14,(pIVar8->ClipRect).Max.x);
      if (((bVar13) && (table->HoveredColumnBody == -1)) && (fVar14 <= (pIVar4->IO).MousePos.x)) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
      }
      if ((!bVar3) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      if (table->RightMostStretchedColumn != -1) {
        table->IsOuterRectMinFitX = false;
      }
      if ((table->IsOuterRectMinFitX & 1U) != 0) {
        (table->WorkRect).Max.x = fVar14;
        (table->OuterRect).Max.x = fVar14;
        fVar14 = ImMin<float>((table->InnerClipRect).Max.x,fVar14);
        (table->InnerClipRect).Max.x = fVar14;
      }
      pIVar2 = table->InnerWindow;
      (pIVar2->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar2->ParentWorkRect).Max = (table->WorkRect).Max;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = (table->InnerClipRect).Max.x;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1U) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if (((table->IsContextPopupOpen & 1U) != 0) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar13 = BeginPopupEx(id,0x141);
        if (bVar13) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      if (((table->IsSortSpecsDirty & 1U) != 0) && ((table->Flags & 8U) != 0)) {
        TableSortSpecsBuild(table);
      }
      pIVar2 = table->InnerWindow;
      if ((table->Flags & 0x80000U) == 0) {
        ImDrawList::PushClipRect
                  (pIVar2->DrawList,(pIVar2->ClipRect).Min,(pIVar2->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar2->DrawList,2);
      }
      return;
    }
    pbVar7 = (byte *)ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,column_4._4_4_);
    bVar11 = *pbVar7;
    i = (int)(char)bVar11;
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
    bVar12 = true;
    if (table->FreezeRowsCount < '\x01') {
      bVar12 = i < table->FreezeColumnsCount;
    }
    pIVar8->NavLayerCurrent = bVar12;
    if (((host_clip_rect.Max.y._3_1_ & 1) != 0) &&
       ((float)(int)table->FreezeColumnsCount == offset_x)) {
      host_clip_rect.Max.x = (width_avail - (table->OuterRect).Min.x) + host_clip_rect.Max.x;
      host_clip_rect.Max.y._3_1_ = 0;
    }
    pIVar8->Flags = pIVar8->Flags & 0xff0fffff;
    if ((table->EnabledMaskByDisplayOrder & 1L << ((byte)column_4._4_4_ & 0x3f)) == 0) {
      (pIVar8->ClipRect).Max.x = host_clip_rect.Max.x;
      (pIVar8->ClipRect).Min.x = host_clip_rect.Max.x;
      pIVar8->WorkMinX = host_clip_rect.Max.x;
      pIVar8->MaxX = host_clip_rect.Max.x;
      pIVar8->MinX = host_clip_rect.Max.x;
      pIVar8->WidthGiven = 0.0;
      (pIVar8->ClipRect).Min.y = width_spacings;
      (pIVar8->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar8->ClipRect,(ImRect *)&column_n_3);
      pIVar8->IsRequestOutput = false;
      pIVar8->IsVisibleY = false;
      pIVar8->IsVisibleX = false;
      pIVar8->IsSkipItems = true;
      pIVar8->ItemWidth = 1.0;
    }
    else {
      if (((bVar13) && ((pIVar8->ClipRect).Min.x <= (pIVar4->IO).MousePos.x)) &&
         ((pIVar4->IO).MousePos.x < (pIVar8->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar11;
      }
      pIVar8->MinX = host_clip_rect.Max.x;
      fVar14 = TableGetMaxColumnWidth(table,i);
      fVar14 = ImMin<float>(pIVar8->WidthGiven,fVar14);
      pIVar8->WidthGiven = fVar14;
      fVar14 = pIVar8->WidthGiven;
      fVar15 = ImMin<float>(pIVar8->WidthRequest,table->MinColumnWidth);
      fVar14 = ImMax<float>(fVar14,fVar15);
      pIVar8->WidthGiven = fVar14;
      pIVar8->MaxX = table->CellPaddingX + table->CellPaddingX +
                     host_clip_rect.Max.x + pIVar8->WidthGiven + table->CellSpacingX1 +
                     table->CellSpacingX2;
      pIVar8->WorkMinX = pIVar8->MinX + table->CellPaddingX + table->CellSpacingX1;
      pIVar8->WorkMaxX = (pIVar8->MaxX - table->CellPaddingX) - table->CellSpacingX2;
      fVar14 = ImFloor(pIVar8->WidthGiven * 0.65);
      pIVar8->ItemWidth = fVar14;
      (pIVar8->ClipRect).Min.x = pIVar8->MinX;
      (pIVar8->ClipRect).Min.y = width_spacings;
      (pIVar8->ClipRect).Max.x = pIVar8->MaxX;
      (pIVar8->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar8->ClipRect,(ImRect *)&column_n_3);
      fVar14 = (pIVar8->ClipRect).Max.x;
      pIVar8->IsVisibleX = (pIVar8->ClipRect).Min.x <= fVar14 && fVar14 != (pIVar8->ClipRect).Min.x;
      pIVar8->IsVisibleY = true;
      bVar5 = pIVar8->IsVisibleX & 1;
      if (bVar5 != 0) {
        table->VisibleMaskByIndex = 1L << (bVar11 & 0x3f) | table->VisibleMaskByIndex;
      }
      local_141 = true;
      if ((bVar5 == 0) && (local_141 = true, pIVar8->AutoFitQueue == '\0')) {
        local_141 = pIVar8->CannotSkipItemsQueue != '\0';
      }
      pIVar8->IsRequestOutput = local_141;
      if ((pIVar8->IsRequestOutput & 1U) != 0) {
        table->RequestOutputMaskByIndex = 1L << (bVar11 & 0x3f) | table->RequestOutputMaskByIndex;
      }
      local_142 = 1;
      if ((pIVar8->IsEnabled & 1U) != 0) {
        local_142 = table->HostSkipItems;
      }
      pIVar8->IsSkipItems = (bool)(local_142 & 1);
      if (((pIVar8->IsSkipItems & 1U) != 0) && (((bVar5 ^ 0xff) & 1) == 0)) {
        __assert_fail("!is_visible",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0x3d5,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      pIVar8->Flags = pIVar8->Flags | 0x100000;
      if (bVar5 != 0) {
        pIVar8->Flags = pIVar8->Flags | 0x200000;
      }
      if (pIVar8->SortOrder != -1) {
        pIVar8->Flags = pIVar8->Flags | 0x400000;
      }
      if (table->HoveredColumnBody == i) {
        pIVar8->Flags = pIVar8->Flags | 0x800000;
      }
      pIVar8->ContentMaxXUnfrozen = pIVar8->WorkMinX;
      pIVar8->ContentMaxXFrozen = pIVar8->WorkMinX;
      pIVar8->ContentMaxXHeadersIdeal = pIVar8->WorkMinX;
      pIVar8->ContentMaxXHeadersUsed = pIVar8->WorkMinX;
      if ((table->HostSkipItems & 1U) == 0) {
        pIVar8->AutoFitQueue = (ImU8)((int)(uint)pIVar8->AutoFitQueue >> 1);
        pIVar8->CannotSkipItemsQueue = (ImU8)((int)(uint)pIVar8->CannotSkipItemsQueue >> 1);
      }
      if ((int)offset_x < (int)table->FreezeColumnsCount) {
        fVar14 = ImClamp<float>(pIVar8->MaxX + 1.0,(float)column_n_3,host_clip_rect.Min.x);
        column_n_3 = (int)fVar14;
      }
      host_clip_rect.Max.x =
           table->CellPaddingX + table->CellPaddingX +
           pIVar8->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + host_clip_rect.Max.x;
      offset_x = (float)((int)offset_x + 1);
    }
    column_4._4_4_ = column_4._4_4_ + 1;
  } while( true );
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int last_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (last_visible_column_idx != -1)
            table->Columns[last_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        last_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
    IM_ASSERT(table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->IsOuterRectMinFitX = false;
    if (table->IsOuterRectMinFitX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}